

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  wally_tx *tx;
  uint uVar1;
  size_type sVar2;
  CfdException *pCVar3;
  uchar *script;
  uchar *asset_00;
  size_type asset_len;
  uchar *value_00;
  size_type value_len;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  uchar *local_490;
  uchar *local_478;
  uchar *local_460;
  undefined1 local_3f8 [8];
  ConfidentialTxOut out;
  string local_2f8;
  size_type local_2d8;
  CfdSourceLocation local_2d0;
  size_type local_2b8;
  CfdSourceLocation local_2b0;
  size_type local_298;
  CfdSourceLocation local_290;
  size_type local_278;
  CfdSourceLocation local_270;
  size_type local_258;
  CfdSourceLocation local_250;
  size_type local_238;
  CfdSourceLocation local_230;
  CfdSourceLocation local_218;
  int local_1fc;
  undefined1 local_1f8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *range_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *surjection_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *nonce_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *asset_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_data;
  ConfidentialValue confidential_value;
  allocator local_99;
  string local_98;
  CfdSourceLocation local_78;
  ByteData *local_60;
  ByteData *surjection_proof_local;
  ConfidentialNonce *nonce_local;
  Script *locking_script_local;
  ConfidentialAssetId *asset_local;
  Amount *value_local;
  ConfidentialTransaction *this_local;
  
  local_60 = surjection_proof;
  surjection_proof_local = (ByteData *)nonce;
  nonce_local = (ConfidentialNonce *)locking_script;
  locking_script_local = (Script *)asset;
  asset_local = (ConfidentialAssetId *)value;
  value_local = (Amount *)this;
  sVar2 = ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          ::size(&this->vout_);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (sVar2 == uVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x88f;
    local_78.funcname = "AddTxOut";
    logger::warn<>(&local_78,"vout maximum.");
    confidential_value._35_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_98,"vout maximum.",&local_99);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_98);
    confidential_value._35_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialValue::ConfidentialValue((ConfidentialValue *)&script_data,(Amount *)asset_local);
  Script::GetData((ByteData *)&asset_data,(Script *)nonce_local);
  ByteData::GetBytes(&local_f8,(ByteData *)&asset_data);
  ByteData::~ByteData((ByteData *)&asset_data);
  local_e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8;
  ConfidentialAssetId::GetData((ByteData *)&value_data,(ConfidentialAssetId *)locking_script_local);
  ByteData::GetBytes(&local_130,(ByteData *)&value_data);
  ByteData::~ByteData((ByteData *)&value_data);
  local_118 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130;
  ConfidentialValue::GetData((ByteData *)&nonce_data,(ConfidentialValue *)&script_data);
  ByteData::GetBytes(&local_168,(ByteData *)&nonce_data);
  ByteData::~ByteData((ByteData *)&nonce_data);
  local_150 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168;
  ConfidentialNonce::GetData
            ((ByteData *)&surjection_data,(ConfidentialNonce *)surjection_proof_local);
  ByteData::GetBytes(&local_1a0,(ByteData *)&surjection_data);
  ByteData::~ByteData((ByteData *)&surjection_data);
  local_188 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data,local_60);
  local_1c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8,range_proof)
  ;
  local_1e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8;
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_e0);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0);
  asset_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_118);
  asset_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_118);
  value_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_150);
  value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_188);
  if (sVar4 == 0) {
    local_460 = (uchar *)0x0;
  }
  else {
    local_460 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_188);
  }
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_188);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1c0);
  if (sVar5 == 0) {
    local_478 = (uchar *)0x0;
  }
  else {
    local_478 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1c0);
  }
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1c0);
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1e0);
  if (sVar6 == 0) {
    local_490 = (uchar *)0x0;
  }
  else {
    local_490 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1e0);
  }
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1e0);
  local_1fc = wally_tx_add_elements_raw_output
                        (tx,script,sVar2,asset_00,asset_len,value_00,value_len,local_460,sVar4,
                         local_478,sVar5,local_490,sVar6,0);
  if (local_1fc != 0) {
    local_218.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_218.filename = local_218.filename + 1;
    local_218.line = 0x8a8;
    local_218.funcname = "AddTxOut";
    logger::warn<int&>(&local_218,"wally_tx_add_elements_raw_output NG[{}].",&local_1fc);
    local_230.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_230.filename = local_230.filename + 1;
    local_230.line = 0x8a9;
    local_230.funcname = "AddTxOut";
    local_238 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0);
    logger::warn<unsigned_long>(&local_230,"script_data.size[{}].",&local_238);
    local_250.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_250.filename = local_250.filename + 1;
    local_250.line = 0x8aa;
    local_250.funcname = "AddTxOut";
    local_258 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_118);
    logger::warn<unsigned_long>(&local_250,"asset_data.size[{}].",&local_258);
    local_270.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_270.filename = local_270.filename + 1;
    local_270.line = 0x8ab;
    local_270.funcname = "AddTxOut";
    local_278 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
    logger::warn<unsigned_long>(&local_270,"value_data.size[{}].",&local_278);
    local_290.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_290.filename = local_290.filename + 1;
    local_290.line = 0x8ac;
    local_290.funcname = "AddTxOut";
    local_298 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_188);
    logger::warn<unsigned_long>(&local_290,"nonce_data.size[{}].",&local_298);
    local_2b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_2b0.filename = local_2b0.filename + 1;
    local_2b0.line = 0x8ad;
    local_2b0.funcname = "AddTxOut";
    local_2b8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1c0);
    logger::warn<unsigned_long>(&local_2b0,"surjection_data.size[{}].",&local_2b8);
    local_2d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_2d0.filename = local_2d0.filename + 1;
    local_2d0.line = 0x8ae;
    local_2d0.funcname = "AddTxOut";
    local_2d8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1e0);
    logger::warn<unsigned_long>(&local_2d0,"range_data.size[{}].",&local_2d8);
    out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2f8,"vout add error.",
               (allocator *)
               ((long)&out.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_2f8);
    out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_3f8,(Script *)nonce_local,
             (ConfidentialAssetId *)locking_script_local,(ConfidentialValue *)&script_data,
             (ConfidentialNonce *)surjection_proof_local,local_60,range_proof);
  ConfidentialTxOut::SetValue((ConfidentialTxOut *)local_3f8,(Amount *)asset_local);
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
  push_back(&this->vout_,(value_type *)local_3f8);
  sVar2 = ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          ::size(&this->vout_);
  ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_3f8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&script_data);
  return (int)sVar2 - 1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  if (vout_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vout maximum.");
    throw CfdException(kCfdIllegalStateError, "vout maximum.");
  }

  ConfidentialValue confidential_value = ConfidentialValue(value);
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data =
      confidential_value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  int ret = wally_tx_add_elements_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), script_data.data(),
      script_data.size(), asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(),
      (nonce_data.size() == 0) ? nullptr : nonce_data.data(),
      nonce_data.size(),
      (surjection_data.size() == 0) ? nullptr : surjection_data.data(),
      surjection_data.size(),
      (range_data.size() == 0) ? nullptr : range_data.data(),
      range_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_output NG[{}].", ret);
    warn(CFD_LOG_SOURCE, "script_data.size[{}].", script_data.size());
    warn(CFD_LOG_SOURCE, "asset_data.size[{}].", asset_data.size());
    warn(CFD_LOG_SOURCE, "value_data.size[{}].", value_data.size());
    warn(CFD_LOG_SOURCE, "nonce_data.size[{}].", nonce_data.size());
    warn(CFD_LOG_SOURCE, "surjection_data.size[{}].", surjection_data.size());
    warn(CFD_LOG_SOURCE, "range_data.size[{}].", range_data.size());
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }

  ConfidentialTxOut out(
      locking_script, asset, confidential_value, nonce, surjection_proof,
      range_proof);
  out.SetValue(value);
  vout_.push_back(out);
  return static_cast<uint32_t>(vout_.size() - 1);
}